

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_parser.cpp
# Opt level: O0

void __thiscall Fn_Anonymous_Test::~Fn_Anonymous_Test(Fn_Anonymous_Test *this)

{
  Fn_Anonymous_Test *this_local;
  
  ~Fn_Anonymous_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(Fn, Anonymous) {
	MockParser mock(
		"let a = fn() {\n"
		"  let b = 3\n"
		"}\n"
		"let b = (fn(a, b, c) {\n"
		"  let d = a + b\n"
		"})\n"
	);

	INS2(BC_SET_F, 0, 1);
	INS2(BC_SET_F, 1, 2);
	INS(BC_RET, 0, 0, 0);

	FN(1);
	INS2(BC_SET_N, 0, 0);
	INS(BC_RET, 0, 0, 0);

	FN(2);
	INS(BC_ADD_LL, 3, 0, 1);
	INS(BC_RET, 0, 0, 0);
}